

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

iterator __thiscall
boost::unordered::detail::foa::
table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
::begin(table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
        *this)

{
  undefined1 auVar1 [16];
  iterator iVar2;
  iterator it;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_18;
  
  local_18.pc_ = (char_pointer)
                 (this->
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 ).arrays.groups_;
  local_18.p_ = (this->
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                ).arrays.elements_;
  if (local_18.p_ == (value_type_pointer)0x0) {
    local_18.p_ = (value_type_pointer)0x0;
  }
  else {
    auVar1[0] = -(((group_type_pointer)local_18.pc_)->m[0].n == '\0');
    auVar1._1_7_ = 0;
    auVar1[8] = -(((group_type_pointer)local_18.pc_)->m[8].n == '\0');
    auVar1[9] = -(((group_type_pointer)local_18.pc_)->m[9].n == '\0');
    auVar1[10] = -(((group_type_pointer)local_18.pc_)->m[10].n == '\0');
    auVar1[0xb] = -(((group_type_pointer)local_18.pc_)->m[0xb].n == '\0');
    auVar1[0xc] = -(((group_type_pointer)local_18.pc_)->m[0xc].n == '\0');
    auVar1[0xd] = -(((group_type_pointer)local_18.pc_)->m[0xd].n == '\0');
    auVar1[0xe] = -(((group_type_pointer)local_18.pc_)->m[0xe].n == '\0');
    auVar1[0xf] = -(((group_type_pointer)local_18.pc_)->m[0xf].n == '\0');
    if ((auVar1 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment(&local_18);
    }
  }
  iVar2.p_ = local_18.p_;
  iVar2.pc_ = local_18.pc_;
  return iVar2;
}

Assistant:

group_type* groups() const noexcept { return std::to_address(groups_); }